

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O0

void golf_graphics_update_proj_view_mat(void)

{
  mat4 m1;
  mat4 m2;
  vec3 up;
  vec3 position;
  vec3 v1;
  vec3 vVar1;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined1 local_180 [8];
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  vec3 local_100;
  undefined8 local_f0;
  float local_e8;
  vec3 local_e0;
  undefined8 local_d0;
  float local_c8;
  vec3 local_c0;
  vec3 local_b0;
  undefined8 local_a0;
  float local_98;
  mat4 local_90;
  mat4 local_50;
  undefined4 local_10;
  undefined4 local_c;
  float far;
  float near;
  
  local_c = 0x3dcccccd;
  local_10 = 0x43160000;
  mat4_perspective_projection
            (&local_50,66.0,graphics.viewport_size.x / graphics.viewport_size.y,0.1,150.0);
  graphics.proj_mat.m[0xc] = local_50.m[0xc];
  graphics.proj_mat.m[0xd] = local_50.m[0xd];
  graphics.proj_mat.m[0xe] = local_50.m[0xe];
  graphics.proj_mat.m[0xf] = local_50.m[0xf];
  graphics.proj_mat.m[8] = local_50.m[8];
  graphics.proj_mat.m[9] = local_50.m[9];
  graphics.proj_mat.m[10] = local_50.m[10];
  graphics.proj_mat.m[0xb] = local_50.m[0xb];
  graphics.proj_mat.m[4] = local_50.m[4];
  graphics.proj_mat.m[5] = local_50.m[5];
  graphics.proj_mat.m[6] = local_50.m[6];
  graphics.proj_mat.m[7] = local_50.m[7];
  graphics.proj_mat.m[0] = local_50.m[0];
  graphics.proj_mat.m[1] = local_50.m[1];
  graphics.proj_mat.m[2] = local_50.m[2];
  graphics.proj_mat.m[3] = local_50.m[3];
  local_b0.z = graphics.cam_pos.z;
  local_b0.x = graphics.cam_pos.x;
  local_b0.y = graphics.cam_pos.y;
  v1.z = graphics.cam_pos.z;
  v1.x = graphics.cam_pos.x;
  v1.y = graphics.cam_pos.y;
  local_c0.z = graphics.cam_dir.z;
  local_c0.x = graphics.cam_dir.x;
  local_c0.y = graphics.cam_dir.y;
  vVar1.z = graphics.cam_dir.z;
  vVar1.x = graphics.cam_dir.x;
  vVar1.y = graphics.cam_dir.y;
  vVar1 = vec3_add(v1,vVar1);
  local_e8 = vVar1.z;
  local_f0 = vVar1._0_8_;
  local_e0.z = graphics.cam_pos.z;
  local_e0.x = graphics.cam_pos.x;
  local_e0.y = graphics.cam_pos.y;
  position.z = graphics.cam_pos.z;
  position.x = graphics.cam_pos.x;
  position.y = graphics.cam_pos.y;
  local_100.z = graphics.cam_up.z;
  local_100.x = graphics.cam_up.x;
  local_100.y = graphics.cam_up.y;
  up.z = graphics.cam_up.z;
  up.x = graphics.cam_up.x;
  up.y = graphics.cam_up.y;
  local_d0 = local_f0;
  local_c8 = local_e8;
  local_a0 = local_f0;
  local_98 = local_e8;
  mat4_look_at(&local_90,position,vVar1,up);
  memcpy(&graphics.view_mat,&local_90,0x40);
  memcpy(local_180,&graphics.proj_mat,0x40);
  memcpy(&local_1c0,&graphics.view_mat,0x40);
  m1.m[2] = (float)(undefined4)local_170;
  m1.m[3] = (float)local_170._4_4_;
  m1.m[0] = (float)(undefined4)uStack_178;
  m1.m[1] = (float)uStack_178._4_4_;
  m1.m[4] = (float)(undefined4)uStack_168;
  m1.m[5] = (float)uStack_168._4_4_;
  m1.m[6] = (float)(undefined4)local_160;
  m1.m[7] = (float)local_160._4_4_;
  m1.m[8] = (float)(undefined4)uStack_158;
  m1.m[9] = (float)uStack_158._4_4_;
  m1.m[10] = (float)(undefined4)local_150;
  m1.m[0xb] = (float)local_150._4_4_;
  m1.m[0xc] = (float)(undefined4)uStack_148;
  m1.m[0xd] = (float)uStack_148._4_4_;
  m1.m[0xe] = (float)(undefined4)local_1c0;
  m1.m[0xf] = (float)local_1c0._4_4_;
  m2.m[2] = (float)(undefined4)local_1b0;
  m2.m[3] = (float)local_1b0._4_4_;
  m2.m[0] = (float)(undefined4)uStack_1b8;
  m2.m[1] = (float)uStack_1b8._4_4_;
  m2.m[4] = (float)(undefined4)uStack_1a8;
  m2.m[5] = (float)uStack_1a8._4_4_;
  m2.m[6] = (float)(undefined4)local_1a0;
  m2.m[7] = (float)local_1a0._4_4_;
  m2.m[8] = (float)(undefined4)uStack_198;
  m2.m[9] = (float)uStack_198._4_4_;
  m2.m[10] = (float)(undefined4)local_190;
  m2.m[0xb] = (float)local_190._4_4_;
  m2.m[0xc] = (float)(undefined4)uStack_188;
  m2.m[0xd] = (float)uStack_188._4_4_;
  m2.m[0xe] = (float)(int)in_stack_fffffffffffffe38;
  m2.m[0xf] = (float)(int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  mat4_multiply(m1,m2);
  memcpy(&graphics.proj_view_mat,local_140,0x40);
  return;
}

Assistant:

void golf_graphics_update_proj_view_mat(void) {
    float near = 0.1f;
    float far = 150.0f;
    graphics.proj_mat = mat4_perspective_projection(66.0f,
            graphics.viewport_size.x / graphics.viewport_size.y, near, far);
    graphics.view_mat = mat4_look_at(graphics.cam_pos,
            vec3_add(graphics.cam_pos, graphics.cam_dir), graphics.cam_up);
    graphics.proj_view_mat = mat4_multiply(graphics.proj_mat, graphics.view_mat);
}